

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTcpServer.cpp
# Opt level: O3

void __thiscall liblogger::LogTcpServer::LogTcpServer(LogTcpServer *this,int port)

{
  ushort uVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  LogException *pLVar6;
  int value;
  stringstream ss;
  string local_1f0;
  undefined4 local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  sockaddr local_40;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogTcpServer_00144938;
  (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&this->m_list;
  (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&this->m_list;
  (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  this->m_port = port;
  this->m_acceptfd = -1;
  this->m_running = false;
  this->m_ctlfd[0] = -1;
  this->m_ctlfd[1] = -1;
  iVar2 = pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    abort();
  }
  iVar2 = socket(2,1,6);
  this->m_acceptfd = iVar2;
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1b8,"Cannot create socket: ",0x16);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(local_1b8,pcVar5);
    pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar6,&local_1f0);
    __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
  }
  iVar2 = socketpair(1,1,0,this->m_ctlfd);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1b8,"Cannot create ctlfd: ",0x15);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(local_1b8,pcVar5);
    pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar6,&local_1f0);
    __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
  }
  local_1cc = 1;
  iVar2 = setsockopt(this->m_acceptfd,1,2,&local_1cc,4);
  if (-1 < iVar2) {
    local_40.sa_data[6] = '\0';
    local_40.sa_data[7] = '\0';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    local_40.sa_data[10] = '\0';
    local_40.sa_data[0xb] = '\0';
    local_40.sa_data[0xc] = '\0';
    local_40.sa_data[0xd] = '\0';
    local_40.sa_family = 2;
    local_40.sa_data[2] = '\0';
    local_40.sa_data[3] = '\0';
    local_40.sa_data[4] = '\0';
    local_40.sa_data[5] = '\0';
    uVar1 = (ushort)this->m_port;
    local_40.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
    iVar2 = bind(this->m_acceptfd,&local_40,0x10);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1b8,"Cannot bind to port: ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,this->m_port);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," error: ",8);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar5);
      pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar6,&local_1f0);
      __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
    }
    iVar2 = listen(this->m_acceptfd,0xf);
    if (-1 < iVar2) {
      iVar2 = pthread_create(&this->m_thread,(pthread_attr_t *)0x0,Run,this);
      if (iVar2 == 0) {
        this->m_running = true;
        return;
      }
      std::__cxx11::stringstream::stringstream(local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1b8,"Cannot start thread: ",0x15);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      std::operator<<(local_1b8,pcVar5);
      pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar6,&local_1f0);
      __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
    }
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1b8,"Cannot listen on port: ",0x17);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,this->m_port);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," error: ",8);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar6,&local_1f0);
    __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
  }
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1b8,"Cannot set SO_REUSEADDR on socket: ",0x23);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  std::operator<<(local_1b8,pcVar5);
  pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar6,&local_1f0);
  __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogTcpServer::LogTcpServer(int port) :
	m_port(port),
	m_acceptfd(-1),
	m_running(false)
{
	m_ctlfd[0] = -1;
	m_ctlfd[1] = -1;
	try
	{
		if (pthread_mutex_init(&m_mutex, NULL) != 0)
			abort();

		m_acceptfd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
		if (m_acceptfd < 0)
		{
			std::stringstream ss;
			ss << "Cannot create socket: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (socketpair(AF_LOCAL, SOCK_STREAM, 0, m_ctlfd) != 0)
		{
			std::stringstream ss;
			ss << "Cannot create ctlfd: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Set SO_REUSEADDR so re can rebind on a port
		int value = 1;
		socklen_t vallen(sizeof(value));
		if (setsockopt(m_acceptfd, SOL_SOCKET, SO_REUSEADDR, &value, vallen) < 0)
		{
			std::stringstream ss;
			ss << "Cannot set SO_REUSEADDR on socket: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Bind etc..
		struct sockaddr_in serv_addr;
		socklen_t sockaddr_len = sizeof(serv_addr);
		memset(&serv_addr, 0, sizeof(serv_addr));
		serv_addr.sin_family = AF_INET;
		serv_addr.sin_addr.s_addr = INADDR_ANY;
		serv_addr.sin_port = htons(m_port);
		if (bind(m_acceptfd, (struct sockaddr *) &serv_addr, sockaddr_len) < 0)
		{
			std::stringstream ss;
			ss << "Cannot bind to port: " << m_port << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (listen(m_acceptfd, 15) < 0)
		{
			std::stringstream ss;
			ss << "Cannot listen on port: " << m_port << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Create thread
		if (pthread_create(&m_thread, NULL, LogTcpServer::Run, this) != 0)
		{
			std::stringstream ss;
			ss << "Cannot start thread: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_running = true;

	} catch(std::exception &ex)
	{
		if (m_acceptfd >= 0)
		{
			if (close(m_acceptfd) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[0] >= 0)
		{
			if (close(m_ctlfd[0]) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[1] >= 0)
		{
			if (close(m_ctlfd[1]) < 0)
			{
				abort();
			}
		}

		throw(ex);
	}
}